

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbt_rule.cpp
# Opt level: O0

void __thiscall icu_63::TransliterationRule::~TransliterationRule(TransliterationRule *this)

{
  void *in_RSI;
  TransliterationRule *this_local;
  
  ~TransliterationRule(this);
  UMemory::operator_delete((UMemory *)this,in_RSI);
  return;
}

Assistant:

TransliterationRule::~TransliterationRule() {
    uprv_free(segments);
    delete anteContext;
    delete key;
    delete postContext;
    delete output;
}